

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O1

uint64_t helper_iwmmxt_packul_aarch64(CPUARMState_conflict *env,uint64_t a,uint64_t b)

{
  (env->iwmmxt).cregs[3] =
       (uint)((b << 0x10) >> 0x30 == 0) << 0x1e | (uint)(b >> 0x10) & 0x80000000 |
       (uint)((short)b == 0) << 0x16 |
       ((uint)b & 0x8000) << 8 |
       (uint)((short)(a >> 0x20) == 0) << 0xe |
       (uint)(a >> 0x20) & 0x8000 | (uint)((a & 0xffff) == 0) << 6 | (uint)(a >> 8) & 0x80;
  return b << 0x10 & 0xffff000000000000 |
         (b & 0xffff) << 0x20 | (ulong)((uint)(a >> 0x10) & 0xffff0000) | a & 0xffff;
}

Assistant:

uint64_t HELPER(iwmmxt_packul)(CPUARMState *env, uint64_t a, uint64_t b)
{
    a = (((a >> 0) & 0xffff) << 0) | (((a >> 32) & 0xffff) << 16) |
        (((b >> 0) & 0xffff) << 32) | (((b >> 32) & 0xffff) << 48);
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT16(a >> 0, 0) | NZBIT16(a >> 16, 1) |
        NZBIT16(a >> 32, 2) | NZBIT16(a >> 48, 3);
    return a;
}